

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O3

void __thiscall json::string::~string(string *this)

{
  pointer pcVar1;
  
  (this->super_value)._vptr_value = (_func_int **)&PTR__string_00150ba0;
  pcVar1 = (this->_data)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->_data).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

~string () {}